

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O1

bool __thiscall
ALSAMidiDriver::processSeqEvent
          (ALSAMidiDriver *this,snd_seq_event_t *seq_event,MidiSession *midiSession)

{
  byte bVar1;
  uchar uVar2;
  uchar *abuf;
  Bit8u *sysexData;
  int *piVar3;
  QDebug QVar4;
  SynthRoute *this_00;
  MasterClockNanos MVar5;
  MidiSession *midiSession_00;
  long aalloc;
  uint uVar6;
  Bit32u msg;
  qsizetype qVar7;
  uint msg_00;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  anon_class_8_1_54a39814_for__M_pred cmp;
  QDebug local_78;
  uint local_70;
  undefined4 uStack_6c;
  QVarLengthArray<unsigned_char,_1000LL> *local_58;
  anon_class_8_1_54a39814_for__M_pred local_50;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  
  this_00 = MidiSession::getSynthRoute(midiSession);
  bVar1 = seq_event->type;
  qVar7 = 0;
  switch(bVar1) {
  case 6:
    msg = *(uint3 *)&seq_event->data | 0x90;
    break;
  case 7:
    msg = *(uint3 *)&seq_event->data | 0x80;
    break;
  case 8:
  case 9:
  case 0xc:
  case 0xf:
    goto switchD_0017363a_caseD_8;
  case 10:
    uVar6 = (seq_event->data).raw32.d[2] << 0x10 |
            (seq_event->data).note.duration << 8 | (uint)(seq_event->data).note.channel;
    goto LAB_001737e4;
  case 0xb:
    msg = (seq_event->data).raw32.d[2] << 8 | (uint)(seq_event->data).note.channel | 0xc0;
    break;
  case 0xd:
    uVar6 = (seq_event->data).raw32.d[2];
    msg = ((uVar6 & 0x3f80) << 9 | (uVar6 & 0x7f) << 8 | (uint)(seq_event->data).note.channel | 0xe0
          ) ^ 0x400000;
    break;
  case 0xe:
    uVar6 = (seq_event->data).note.duration;
    if ((uVar6 & 0xe0) == 0x20) goto LAB_00173a1b;
    uVar6 = ((seq_event->data).raw32.d[2] & 0xffffff80) << 9 |
            uVar6 << 8 | (uint)(seq_event->data).note.channel;
LAB_001737e4:
    msg = uVar6 | 0xb0;
    break;
  case 0x10:
    if ((seq_event->data).note.duration != 0) goto LAB_00173a1b;
    uVar6 = (uint)(seq_event->data).note.channel;
    msg_00 = uVar6 | 0x64b0;
    MVar5 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(this_00,midiSession,msg_00,MVar5);
    MVar5 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(this_00,midiSession,uVar6 | 0x65b0,MVar5);
    msg = ((seq_event->data).raw32.d[2] << 9 | msg_00) & 0x7f00ff | 0x600;
    break;
  default:
    switch(bVar1) {
    case 0x3c:
      local_50.t._0_4_ = 2;
      local_50.t._4_4_ = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_3c = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QVar4.stream = local_78.stream;
      QVar8.m_data = (storage_type *)0x1c;
      QVar8.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_70);
      piVar3 = (int *)CONCAT44(uStack_6c,local_70);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,8);
        }
      }
      if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.stream,' ');
      }
      goto LAB_00173a13;
    case 0x3d:
      local_50.t._0_4_ = 2;
      local_50.t._4_4_ = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_3c = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QVar4.stream = local_78.stream;
      QVar9.m_data = (storage_type *)0x1b;
      QVar9.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_70);
      piVar3 = (int *)CONCAT44(uStack_6c,local_70);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,8);
        }
      }
      if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.stream,' ');
      }
      QDebug::~QDebug(&local_78);
      qVar7 = 1;
      goto switchD_0017363a_caseD_8;
    case 0x3e:
      local_50.t._0_4_ = 2;
      local_50.t._4_4_ = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_3c = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QVar4.stream = local_78.stream;
      QVar10.m_data = (storage_type *)0x1d;
      QVar10.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_70);
      piVar3 = (int *)CONCAT44(uStack_6c,local_70);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,8);
        }
      }
      if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.stream,' ');
      }
LAB_00173a13:
      QDebug::~QDebug(&local_78);
      break;
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
      goto switchD_0017363a_caseD_8;
    case 0x43:
      uVar6 = (uint)(ushort)((short)(&seq_event->source)[(ulong)((bVar1 & 0xfe) == 0x42) * 2] << 8 |
                            (ushort)(&seq_event->source)[(ulong)((bVar1 & 0xfe) == 0x42) * 2] >> 8);
      midiSession_00 = findMidiSessionForClient(this,uVar6);
      if (midiSession_00 != (MidiSession *)0x0) {
        MidiDriver::deleteMidiSession(&this->super_MidiDriver,midiSession_00);
      }
      local_50.t = &local_70;
      local_70 = uVar6;
      QtPrivate::
      sequential_erase_if<QList<unsigned_int>,QtPrivate::sequential_erase<QList<unsigned_int>,unsigned_int>(QList<unsigned_int>&,unsigned_int_const&)::_lambda(auto:1&)_1_>
                (&this->clients,&local_50);
      break;
    default:
      if (bVar1 != 0x82) goto switchD_0017363a_caseD_8;
      uVar6 = (seq_event->data).raw32.d[0];
      if ((ulong)uVar6 != 0) {
        abuf = (uchar *)(seq_event->data).ext.ptr;
        uVar2 = abuf[uVar6 - 1];
        if ((*abuf == 0xf0) && (uVar2 == 0xf7)) {
          MVar5 = MasterClock::getClockNanos();
          SynthRoute::pushMIDISysex(this_00,midiSession,abuf,uVar6,MVar5);
        }
        else {
          local_58 = &this->sysexBuffer;
          QVarLengthArray<unsigned_char,_1000LL>::append(local_58,abuf,(ulong)uVar6);
          if (uVar2 == 0xf7) {
            sysexData = (this->sysexBuffer).ptr;
            qVar7 = (this->sysexBuffer).s;
            MVar5 = MasterClock::getClockNanos();
            SynthRoute::pushMIDISysex(this_00,midiSession,sysexData,(uint)qVar7,MVar5);
            aalloc = (this->sysexBuffer).a;
            qVar7 = 0;
            if (aalloc < 1) {
              aalloc = qVar7;
            }
            QVarLengthArray<unsigned_char,_1000LL>::reallocate(local_58,0,aalloc);
            goto switchD_0017363a_caseD_8;
          }
        }
      }
    }
    goto LAB_00173a1b;
  }
  MVar5 = MasterClock::getClockNanos();
  SynthRoute::pushMIDIShortMessage(this_00,midiSession,msg,MVar5);
LAB_00173a1b:
  qVar7 = 0;
switchD_0017363a_caseD_8:
  return SUB81(qVar7,0);
}

Assistant:

bool ALSAMidiDriver::processSeqEvent(snd_seq_event_t *seq_event, MidiSession *midiSession) {
	SynthRoute *synthRoute = midiSession->getSynthRoute();
	MT32Emu::Bit32u msg = 0;
	switch(seq_event->type) {
	case SND_SEQ_EVENT_NOTEON:
		msg = 0x90;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NOTEOFF:
		msg = 0x80;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROLLER:
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= seq_event->data.control.value << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROL14:
		// The real hardware units don't support any of LSB controllers,
		// so we just send the MSB silently ignoring the LSB
		if ((seq_event->data.control.param & 0xE0) == 0x20) break;
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= (seq_event->data.control.value >> 7) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NONREGPARAM:
		// The real hardware units don't support NRPNs
		break;

	case SND_SEQ_EVENT_REGPARAM:
		// The real hardware units support only RPN 0 (pitch bender range) and only MSB matters
		if (seq_event->data.control.param != 0) break;
		msg = 0x64B0;
		msg |= seq_event->data.control.channel;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x6500;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x0600;
		msg |= ((seq_event->data.control.value >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PGMCHANGE:
		msg = 0xC0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.value << 8;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PITCHBEND:
		msg = 0xE0;
		msg |= seq_event->data.control.channel;
		int bend;
		bend = seq_event->data.control.value + 8192;
		msg |= (bend & 0x7F) << 8;
		msg |= ((bend >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_SYSEX: {
		MT32Emu::Bit8u *sysexData = (MT32Emu::Bit8u *)seq_event->data.ext.ptr;
		uint sysexLength = seq_event->data.ext.len;

		if(sysexLength == 0) break; // no-op

		// We may well get a SysEx fragment, so if this is the case, it's buffered and the full SysEx is reconstructed further on.
		// If not, don't bother and take a shortcut.
		bool hasSysexStart = sysexData[0] == MIDI_CMD_COMMON_SYSEX;
		bool hasSysexEnd = sysexData[sysexLength - 1] == MIDI_CMD_COMMON_SYSEX_END;
		if (hasSysexStart && hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexData, sysexLength, MasterClock::getClockNanos());
			break;
		}
		// OK, accumulate SysEx data received so far and commit when ready.
		sysexBuffer.append(sysexData, sysexLength);
		if (hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexBuffer.constData(), sysexBuffer.size(), MasterClock::getClockNanos());
			sysexBuffer.clear();
		}
		break;
	}

	case SND_SEQ_EVENT_PORT_SUBSCRIBED:
		// no-op
		break;
	case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
		unsigned int clientAddr;
		clientAddr = getSourceAddr(seq_event);
		MidiSession *midiSession;
		midiSession = findMidiSessionForClient(clientAddr);
		if (midiSession != NULL) deleteMidiSession(midiSession);
		clients.removeAll(clientAddr);
		break;

	case SND_SEQ_EVENT_CLIENT_START:
		qDebug() << "ALSAMidiDriver: Client start";
		break;
	case SND_SEQ_EVENT_CLIENT_CHANGE:
		qDebug() << "ALSAMidiDriver: Client change";
		break;
	case SND_SEQ_EVENT_CLIENT_EXIT:
		qDebug() << "ALSAMidiDriver: Client exit";
		return true;

	case SND_SEQ_EVENT_NOTE:
		// FIXME: Implement these
		break;

	default:
		break;
	}
	return false;
}